

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Token * __thiscall wabt::WastParser::TokenQueue::at(TokenQueue *this,size_t n)

{
  ulong uVar1;
  
  if (1 < n) {
    __assert_fail("n <= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/wast-parser.cc"
                  ,0xf29,"const Token &wabt::WastParser::TokenQueue::at(size_t) const");
  }
  uVar1 = this->i ^ n;
  if ((this->tokens)._M_elems[uVar1].super__Optional_base<wabt::Token,_true,_true>._M_payload.
      super__Optional_payload_base<wabt::Token>._M_engaged != false) {
    return (Token *)((this->tokens)._M_elems + uVar1);
  }
  std::__throw_bad_optional_access();
}

Assistant:

const Token& WastParser::TokenQueue::at(size_t n) const {
  assert(n <= 1);
  return tokens[i ^ static_cast<bool>(n)].value();
}